

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O2

String * __thiscall
kj::str<char_const(&)[16],unsigned_char&>
          (String *__return_storage_ptr__,kj *this,char (*params) [16],uchar *params_1)

{
  CappedArray<char,_5UL> CVar1;
  CappedArray<char,_5UL> local_38;
  ArrayPtr<const_char> local_28;
  
  local_28 = toCharSequence<char_const(&)[16]>((char (*) [16])this);
  CVar1 = toCharSequence<unsigned_char&>((uchar *)params);
  local_38.currentSize = CVar1.currentSize;
  local_38.content._0_4_ = CVar1.content._0_4_;
  local_38.content[4] = CVar1.content[4];
  _::concat<kj::ArrayPtr<char_const>,kj::CappedArray<char,5ul>>
            (__return_storage_ptr__,(_ *)&local_28,(ArrayPtr<const_char> *)&local_38,&local_38);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}